

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<IOVariable,_8UL>::push_back
          (SmallVector<IOVariable,_8UL> *this,IOVariable *t)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined7 uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  IOVariable *pIVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  IOVariable *pIVar13;
  ulong uVar14;
  
  uVar14 = (this->super_VectorView<IOVariable>).buffer_size;
  uVar12 = uVar14 + 1;
  if (uVar12 < 0xaaaaaaaaaaaaaab) {
    uVar11 = this->buffer_capacity;
    if (uVar11 < uVar12) {
      uVar8 = 8;
      if (8 < uVar11) {
        uVar8 = uVar11;
      }
      do {
        uVar11 = uVar8;
        uVar8 = uVar11 * 2;
      } while (uVar11 < uVar12);
      if (uVar11 < 9) {
        pIVar9 = (IOVariable *)&this->stack_storage;
      }
      else {
        pIVar9 = (IOVariable *)malloc(uVar11 * 0x18);
        if (pIVar9 == (IOVariable *)0x0) goto LAB_00180167;
      }
      pIVar13 = (this->super_VectorView<IOVariable>).ptr;
      if ((uVar14 != 0) && (pIVar9 != pIVar13)) {
        lVar10 = 0;
        uVar12 = 0;
        do {
          pIVar13 = (this->super_VectorView<IOVariable>).ptr;
          *(undefined8 *)(&pIVar9->block + lVar10) = *(undefined8 *)(&pIVar13->block + lVar10);
          puVar2 = (undefined8 *)((long)&pIVar13->var + lVar10);
          uVar4 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pIVar9->var + lVar10);
          *puVar3 = *puVar2;
          puVar3[1] = uVar4;
          uVar12 = uVar12 + 1;
          uVar14 = (this->super_VectorView<IOVariable>).buffer_size;
          lVar10 = lVar10 + 0x18;
        } while (uVar12 < uVar14);
        pIVar13 = (this->super_VectorView<IOVariable>).ptr;
      }
      if (pIVar13 != (IOVariable *)&this->stack_storage) {
        free(pIVar13);
        uVar14 = (this->super_VectorView<IOVariable>).buffer_size;
      }
      (this->super_VectorView<IOVariable>).ptr = pIVar9;
      this->buffer_capacity = uVar11;
    }
    else {
      pIVar9 = (this->super_VectorView<IOVariable>).ptr;
    }
    uVar5 = *(undefined7 *)&t->field_0x11;
    pIVar9[uVar14].block = t->block;
    *(undefined7 *)&pIVar9[uVar14].field_0x11 = uVar5;
    uVar6 = t->location;
    uVar7 = t->block_member_index;
    pIVar9 = pIVar9 + uVar14;
    pIVar9->var = t->var;
    pIVar9->location = uVar6;
    pIVar9->block_member_index = uVar7;
    psVar1 = &(this->super_VectorView<IOVariable>).buffer_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
LAB_00180167:
  ::std::terminate();
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}